

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

void helicsInputGetComplex(HelicsInput inp,double *real,double *imag,HelicsError *err)

{
  InputObject *pIVar1;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  
  pIVar1 = anon_unknown.dwarf_694c0::verifyInput(inp,err);
  if (pIVar1 != (InputObject *)0x0) {
    helics::Input::getValue_impl<std::complex<double>>(pIVar1->inputPtr);
    if (real != (double *)0x0) {
      *real = extraout_XMM0_Qa;
    }
    if (imag != (double *)0x0) {
      *imag = in_XMM1_Qa;
    }
  }
  return;
}

Assistant:

void helicsInputGetComplex(HelicsInput inp, double* real, double* imag, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return;
    }
    try {
        auto cval = inpObj->inputPtr->getValue<std::complex<double>>();
        if (real != nullptr) {
            *real = cval.real();
        }
        if (imag != nullptr) {
            *imag = cval.imag();
        }
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}